

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRadiusDimension::IfcRadiusDimension(IfcRadiusDimension *this)

{
  IfcRadiusDimension *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68,
             "IfcRadiusDimension");
  IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
            (&this->super_IfcDimensionCurveDirectedCallout,&PTR_construction_vtable_24__00f721d0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRadiusDimension,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRadiusDimension,_0UL> *)
             &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58,
             &PTR_construction_vtable_24__00f72280);
  (this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf720f0;
  *(undefined8 *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68 = 0xf721b8;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf72118;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf72140;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x48 = 0xf72168;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58 = 0xf72190;
  return;
}

Assistant:

IfcRadiusDimension() : Object("IfcRadiusDimension") {}